

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulkan_mock.cpp
# Opt level: O2

VkResult fill_out_count_pointer_pair<VkSurfaceFormatKHR>
                   (vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> *data_vec,
                   uint32_t *pCount,VkSurfaceFormatKHR *pData)

{
  VkResult VVar1;
  size_t i;
  ulong uVar2;
  ulong uVar3;
  
  if (pCount != (uint32_t *)0x0) {
    if (pData == (VkSurfaceFormatKHR *)0x0) {
      uVar3 = (ulong)(*(long *)(data_vec + 8) - *(long *)data_vec) >> 3;
      VVar1 = VK_SUCCESS;
    }
    else {
      uVar2 = *(long *)(data_vec + 8) - *(long *)data_vec >> 3;
      uVar3 = (ulong)*pCount;
      if (uVar2 <= uVar3) {
        uVar3 = uVar2 & 0xffffffff;
      }
      for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 1) {
        pData[uVar2] = *(VkSurfaceFormatKHR *)(*(long *)data_vec + uVar2 * 8);
      }
      VVar1 = (uint)((ulong)*pCount < (ulong)(*(long *)(data_vec + 8) - *(long *)data_vec >> 3)) * 5
      ;
    }
    *pCount = (uint32_t)uVar3;
    return VVar1;
  }
  return VK_ERROR_OUT_OF_HOST_MEMORY;
}

Assistant:

VkResult fill_out_count_pointer_pair(std::vector<T> const& data_vec, uint32_t* pCount, T* pData) {
    if (pCount == nullptr) {
        return VK_ERROR_OUT_OF_HOST_MEMORY;
    }
    if (pData == nullptr) {
        if (pCount) *pCount = static_cast<uint32_t>(data_vec.size());
        return VK_SUCCESS;
    } else {
        uint32_t amount_written = 0;
        uint32_t amount_to_write = static_cast<uint32_t>(data_vec.size());
        if (*pCount < data_vec.size()) {
            amount_to_write = *pCount;
        }
        for (size_t i = 0; i < amount_to_write; i++) {
            pData[i] = data_vec[i];
            amount_written++;
        }
        if (*pCount < data_vec.size()) {
            *pCount = amount_written;
            return VK_INCOMPLETE;
        }
        *pCount = amount_written;
        return VK_SUCCESS;
    }
}